

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

bool xmrig::Buffer::fromHex(uint8_t *in,size_t size,uint8_t *out)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar7;
  bool bVar6;
  
  bVar7 = size == 0;
  if (!bVar7) {
    uVar4 = 0;
    bVar6 = false;
    bVar5 = false;
    do {
      uVar1 = in[uVar4];
      bVar2 = uVar1 - 0x30;
      if (9 < bVar2) {
        if ((byte)(uVar1 + 0x9f) < 6) {
          bVar2 = uVar1 + 0xa9;
        }
        else {
          bVar2 = uVar1 - 0x37;
          bVar5 = bVar6;
          if (5 < (byte)(uVar1 + 0xbf)) {
            bVar6 = true;
            bVar2 = 0;
            bVar5 = bVar6;
          }
        }
      }
      uVar1 = in[uVar4 + 1];
      bVar3 = uVar1 - 0x30;
      if (9 < bVar3) {
        if ((byte)(uVar1 + 0x9f) < 6) {
          bVar3 = uVar1 + 0xa9;
        }
        else {
          bVar3 = uVar1 - 0x37;
          bVar6 = bVar5;
          if (5 < (byte)(uVar1 + 0xbf)) {
            bVar5 = true;
            bVar3 = 0;
            bVar6 = bVar5;
          }
        }
      }
      out[uVar4 >> 1] = bVar2 * '\x10' + bVar3;
      if (bVar5) {
        return bVar7;
      }
      uVar4 = uVar4 + 2;
      bVar7 = uVar4 >= size;
    } while (uVar4 < size);
  }
  return bVar7;
}

Assistant:

bool xmrig::Buffer::fromHex(const uint8_t *in, size_t size, uint8_t *out)
{
    bool error = false;
    for (size_t i = 0; i < size; i += 2) {
        out[i / 2] = static_cast<uint8_t>((hf_hex2bin(in[i], error) << 4) | hf_hex2bin(in[i + 1], error));

        if (error) {
            return false;
        }
    }

    return true;
}